

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O0

int require_function_datatype(Context_conflict *ctx,MOJOSHADER_astDataType *datatype)

{
  MOJOSHADER_astDataType *pMVar1;
  MOJOSHADER_astDataType *datatype_local;
  Context_conflict *ctx_local;
  
  pMVar1 = reduce_datatype(ctx,datatype);
  if ((pMVar1 == (MOJOSHADER_astDataType *)0x0) ||
     (pMVar1->type != MOJOSHADER_AST_DATATYPE_FUNCTION)) {
    fail(ctx,"expected function");
    ctx_local._4_4_ = 0;
  }
  else {
    ctx_local._4_4_ = 1;
  }
  return ctx_local._4_4_;
}

Assistant:

static int require_function_datatype(Context *ctx,
                                     const MOJOSHADER_astDataType *datatype)
{
    datatype = reduce_datatype(ctx, datatype);
    if ((!datatype) || (datatype->type != MOJOSHADER_AST_DATATYPE_FUNCTION))
    {
        fail(ctx, "expected function");
        return 0;
    } // if

    return 1;
}